

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

void rapidxml::xml_document<char>::insert_coded_character<0>(char **text,unsigned_long code)

{
  char *pcVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  undefined8 *puVar5;
  uint uVar6;
  
  if (code < 0x80) {
    lVar4 = 1;
  }
  else {
    uVar6 = (uint)code;
    bVar3 = (byte)code;
    if (code < 0x800) {
      code = (unsigned_long)(byte)((byte)(uVar6 >> 6) | 0xc0);
      (*text)[1] = bVar3 & 0x3f | 0x80;
      lVar4 = 2;
    }
    else if (code < 0x10000) {
      (*text)[2] = bVar3 & 0x3f | 0x80;
      uVar2 = code >> 6;
      code = (unsigned_long)(byte)((byte)(uVar6 >> 0xc) | 0xe0);
      (*text)[1] = (byte)uVar2 & 0x3f | 0x80;
      lVar4 = 3;
    }
    else {
      if (0x10ffff < code) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
        pcVar1 = *text;
        *puVar5 = &PTR__exception_00159668;
        puVar5[1] = "invalid numeric character entity";
        puVar5[2] = pcVar1;
        __cxa_throw(puVar5,&parse_error::typeinfo,std::exception::~exception);
      }
      (*text)[3] = bVar3 & 0x3f | 0x80;
      (*text)[2] = (byte)(code >> 6) & 0x3f | 0x80;
      uVar2 = code >> 0xc;
      code = (unsigned_long)(byte)((byte)(uVar6 >> 0x12) | 0xf0);
      (*text)[1] = (byte)uVar2 & 0x3f | 0x80;
      lVar4 = 4;
    }
  }
  **text = (char)code;
  *text = *text + lVar4;
  return;
}

Assistant:

static void insert_coded_character(Ch *&text, unsigned long code)
        {
            if (Flags & parse_no_utf8)
            {
                // Insert 8-bit ASCII character
                // Todo: possibly verify that code is less than 256 and use replacement char otherwise?
                text[0] = static_cast<unsigned char>(code);
                text += 1;
            }
            else
            {
                // Insert UTF8 sequence
                if (code < 0x80)    // 1 byte sequence
                {
	                text[0] = static_cast<unsigned char>(code);
                    text += 1;
                }
                else if (code < 0x800)  // 2 byte sequence
                {
	                text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[0] = static_cast<unsigned char>(code | 0xC0);
                    text += 2;
                }
	            else if (code < 0x10000)    // 3 byte sequence
                {
	                text[2] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[0] = static_cast<unsigned char>(code | 0xE0);
                    text += 3;
                }
	            else if (code < 0x110000)   // 4 byte sequence
                {
	                text[3] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[2] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[1] = static_cast<unsigned char>((code | 0x80) & 0xBF); code >>= 6;
	                text[0] = static_cast<unsigned char>(code | 0xF0);
                    text += 4;
                }
                else    // Invalid, only codes up to 0x10FFFF are allowed in Unicode
                {
                    RAPIDXML_PARSE_ERROR("invalid numeric character entity", text);
                }
            }
        }